

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable.hpp
# Opt level: O2

__pid_t __thiscall boost::condition_variable::wait(condition_variable *this,void *__stat_loc)

{
  uint ev;
  __pid_t extraout_EAX;
  lock_on_exit<boost::unique_lock<boost::mutex>_> guard;
  interruption_checker check_for_interruption;
  lock_on_exit<boost::unique_lock<boost::mutex>_> local_60;
  condition_error local_58;
  
  local_60.m = (unique_lock<boost::mutex> *)0x0;
  detail::interruption_checker::interruption_checker
            ((interruption_checker *)&local_58,&this->internal_mutex,&this->cond);
  unique_lock<boost::mutex>::unlock((unique_lock<boost::mutex> *)__stat_loc);
  local_60.m = (unique_lock<boost::mutex> *)__stat_loc;
  ev = pthread_cond_wait((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this);
  detail::interruption_checker::unlock_if_locked((interruption_checker *)&local_58);
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::deactivate(&local_60);
  detail::interruption_checker::unlock_if_locked((interruption_checker *)&local_58);
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::~lock_on_exit(&local_60);
  this_thread::interruption_point();
  if ((ev & 0xfffffffb) == 0) {
    return extraout_EAX;
  }
  condition_error::condition_error
            (&local_58,ev,"boost::condition_variable::wait failed in pthread_cond_wait");
  throw_exception<boost::condition_error>(&local_58);
}

Assistant:

inline void condition_variable::wait(unique_lock<mutex>& m)
    {
#if defined BOOST_THREAD_THROW_IF_PRECONDITION_NOT_SATISFIED
        if(! m.owns_lock())
        {
            boost::throw_exception(condition_error(-1, "boost::condition_variable::wait() failed precondition mutex not owned"));
        }
#endif
        int res=0;
        {
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
            thread_cv_detail::lock_on_exit<unique_lock<mutex> > guard;
            detail::interruption_checker check_for_interruption(&internal_mutex,&cond);
            pthread_mutex_t* the_mutex = &internal_mutex;
            guard.activate(m);
            res = pthread_cond_wait(&cond,the_mutex);
            check_for_interruption.unlock_if_locked();
            guard.deactivate();
#else
            pthread_mutex_t* the_mutex = m.mutex()->native_handle();
            res = pthread_cond_wait(&cond,the_mutex);
#endif
        }
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
        this_thread::interruption_point();
#endif
        if(res && res != EINTR)
        {
            boost::throw_exception(condition_error(res, "boost::condition_variable::wait failed in pthread_cond_wait"));
        }
    }